

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_failure_fail_tests.cpp
# Opt level: O0

void __thiscall
iu_NoFailureTest_x_iutest_x_Assert_Test::Body(iu_NoFailureTest_x_iutest_x_Assert_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionHelper local_1f8;
  Fixed local_1c8;
  int local_40;
  undefined1 local_30 [8];
  Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
  iutest_failure_checker;
  iu_NoFailureTest_x_iutest_x_Assert_Test *this_local;
  
  iutest_failure_checker._24_8_ = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
               *)local_30);
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      OccurFatalFailure();
    }
    iVar2 = iutest::detail::NewTestPartResultCheckHelper::
            Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
            ::count((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                     *)local_30);
    if (iVar2 < 1) {
      local_40 = 0;
    }
    else {
      local_40 = 3;
    }
    iutest::detail::NewTestPartResultCheckHelper::
    Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
    ::~Counter((Counter<iutest::detail::NewTestPartResultCheckHelper::CondGt<(iutest::TestPartResult::Type)0>,_iutest::detail::DefaultGlobalTestPartResultReporter>
                *)local_30);
    if (local_40 == 0) {
      nCount = nCount + 1;
      return;
    }
  }
  memset(&local_1c8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
  iutest::AssertionHelper::AssertionHelper
            (&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_failure_fail_tests.cpp"
             ,0x26,
             "\nExpected: OccurFatalFailure() doesn\'t generate new failure.\n  Actual: it does.",
             kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1f8,&local_1c8);
  iutest::AssertionHelper::~AssertionHelper(&local_1f8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  return;
}

Assistant:

IUTEST(NoFailureTest, Assert)
{
    IUTEST_ASSERT_NO_FAILURE(OccurFatalFailure());
    ++nCount;
}